

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int sock_destroy(SOCKINFO *info,int ShutdownMethod)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char errorBuffer [256];
  undefined1 auStack_118 [264];
  
  if (info->socket == -1) {
    iVar1 = 0;
  }
  else {
    iVar1 = shutdown(info->socket,ShutdownMethod);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      __xpg_strerror_r(*piVar3,auStack_118,0x100);
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/sock.c",0x89,"Error in shutdown: %s\n",
                 auStack_118);
    }
    if (info->socket == -1) {
      iVar1 = -0xd0;
    }
    else {
      iVar2 = close(info->socket);
      iVar1 = -0xd0;
      if (iVar2 != -1) {
        iVar1 = 0;
      }
    }
    info->socket = -1;
  }
  return iVar1;
}

Assistant:

int sock_destroy(SOCKINFO *info, int ShutdownMethod)
{
	int ret = UPNP_E_SUCCESS;
	char errorBuffer[ERROR_BUFFER_LEN];

	if (info->socket != INVALID_SOCKET) {
#ifdef UPNP_ENABLE_OPEN_SSL
		if (info->ssl) {
			SSL_shutdown(info->ssl);
			SSL_free(info->ssl);
			info->ssl = NULL;
		}
#endif
		if (shutdown(info->socket, ShutdownMethod) == -1) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"Error in shutdown: %s\n",
				errorBuffer);
		}
		if (sock_close(info->socket) == -1) {
			ret = UPNP_E_SOCKET_ERROR;
		}
		info->socket = INVALID_SOCKET;
	}

	return ret;
}